

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_entityboss.cpp
# Opt level: O3

int AF_A_EntityAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  int iVar5;
  PClass *pPVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  VMValue params [3];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f4110;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f4100;
  puVar2 = (undefined8 *)(param->field_0).field_1.a;
  pVVar8 = param;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar2 != (undefined8 *)0x0) {
      auVar11._8_8_ = uVar7;
      auVar11._0_8_ = puVar2[1];
      if (puVar2[1] == 0) {
        auVar11 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = auVar11._0_8_;
      }
      pPVar6 = auVar11._0_8_;
      bVar9 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar7 = (ulong)bVar9;
      bVar10 = pPVar6 == pPVar3;
      if (!bVar10 && !bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005f4110;
      }
    }
  }
  else if (puVar2 != (undefined8 *)0x0) goto LAB_005f4100;
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005f3fb2;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005f4100:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005f4110;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar6 = (PClass *)puVar2[1];
        if (pPVar6 == (PClass *)0x0) {
          pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
          puVar2[1] = pPVar6;
        }
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f4110;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005f4100;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f3fb2:
    uVar4 = FRandom::GenRand32(&pr_entity);
    iVar5 = (*(code *)(&DAT_007797f4 +
                      *(int *)(&DAT_007797f4 +
                              (ulong)(byte)((char)uVar4 + (char)((uVar4 & 0xff) / 5) * -5) * 4)))();
    return iVar5;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005f4110:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_EntityAttack)
{
	PARAM_ACTION_PROLOGUE;

	// Apparent Strife bug: Case 5 was unreachable because they used % 5 instead of % 6.
	// I've fixed that by making case 1 duplicate it, since case 1 did nothing.
	switch (pr_entity() % 5)
	{
	case 0:
		CALL_ACTION(A_SpotLightning, self);
		break;

	case 2:
		A_SpectralMissile (self, "SpectralLightningH3");
		break;

	case 3:
		CALL_ACTION(A_Spectre3Attack, self);
		break;

	case 4:
		A_SpectralMissile (self, "SpectralLightningBigV2");
		break;

	case 1:
	case 5:
		A_SpectralMissile (self, "SpectralLightningBigBall2");
		break;
	}
	return 0;
}